

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

void * __thiscall absl::synchronization_internal::GraphCycles::Ptr(GraphCycles *this,GraphId id)

{
  Node *pNVar1;
  void *pvVar2;
  
  pNVar1 = (this->rep_->nodes_).ptr_[id.handle & 0xffffffff];
  pvVar2 = (void *)0x0;
  if ((pNVar1 != (Node *)0x0) && (pNVar1->version == (uint32_t)(id.handle >> 0x20))) {
    pvVar2 = (void *)(pNVar1->masked_ptr ^ 0xf03a5f7bf03a5f7b);
  }
  return pvVar2;
}

Assistant:

void* GraphCycles::Ptr(GraphId id) {
  Node* n = FindNode(rep_, id);
  return n == nullptr ? nullptr
                      : base_internal::UnhidePtr<void>(n->masked_ptr);
}